

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O1

bool __thiscall pg::RTLSolver::rtl(RTLSolver *this,bitset *SG,int only_player,int depth)

{
  bitset *this_00;
  ulong *puVar1;
  uint maxpr;
  int iVar2;
  Game *pGVar3;
  uint64_t *puVar4;
  char cVar5;
  bitset *pbVar6;
  bitset *R_00;
  bool bVar7;
  uint pl;
  uint uVar8;
  uint64_t *puVar9;
  long lVar10;
  ostream *poVar11;
  size_t sVar12;
  Error *this_01;
  undefined4 in_register_0000000c;
  int *piVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bitset Z;
  bitset R;
  ulong local_c8;
  bitset local_b0;
  ulong local_90;
  _label_vertex local_88;
  int local_78;
  int local_74;
  ulong local_70;
  bitset *local_68;
  bitset *local_60;
  bitset local_58;
  bitset *local_38;
  
  local_70 = CONCAT44(in_register_0000000c,depth);
  local_58._size = SG->_size;
  uVar19 = SG->_bitssize;
  uVar17 = uVar19 * 8;
  local_58._bitssize = uVar19;
  local_58._allocsize = uVar17;
  puVar9 = (uint64_t *)operator_new__(-(ulong)(uVar19 >> 0x3d != 0) | uVar17);
  local_58._bits = puVar9;
  if (uVar19 != 0) {
    memmove(puVar9,SG->_bits,uVar17);
  }
  local_b0._size = ((this->super_Solver).game)->n_vertices;
  uVar17 = local_b0._size + 0x3f;
  local_b0._bitssize = uVar17 >> 6;
  uVar20 = local_b0._bitssize << 3;
  local_b0._allocsize = uVar20;
  local_b0._bits = (uint64_t *)operator_new__(uVar20);
  if (0x3f < uVar17) {
    memset(local_b0._bits,0,uVar20);
  }
  local_c8 = 0xffffffffffffffff;
  if (uVar19 != 0) {
    lVar10 = uVar19 * -0x40;
    do {
      lVar10 = lVar10 + 0x40;
      if (puVar9[uVar19 - 1] != 0) {
        local_c8 = LZCOUNT(puVar9[uVar19 - 1]) - lVar10 ^ 0x3f;
        break;
      }
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  if (local_c8 != 0xffffffffffffffff) {
    this_00 = &this->V;
    local_60 = &this->W;
    local_68 = &this->S;
    local_38 = &this->G;
    local_78 = (int)local_70 + 1;
    local_90 = 0;
LAB_00177450:
    maxpr = ((this->super_Solver).game)->_priority[(int)local_c8];
    pl = maxpr & 1;
    if ((only_player == -1) || (pl == only_player)) {
      bVar21 = local_c8 == 0xffffffffffffffff;
      if (!bVar21) {
        lVar10 = (long)(int)local_c8;
        uVar15 = ((this->super_Solver).game)->_priority[lVar10];
        while (((uVar15 ^ maxpr) & 1) == 0) {
          if (1 < (this->super_Solver).trace) {
            poVar11 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"\x1b[1;37mattracting to \x1b[36m",0x1a);
            local_88.g = (this->super_Solver).game;
            local_88.v = (uint)local_c8;
            poVar11 = operator<<(poVar11,&local_88);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\x1b[m for \x1b[1;36m",0xf);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\x1b[m",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," (pr: ",6);
            poVar11 = (ostream *)
                      std::ostream::operator<<
                                (poVar11,((this->super_Solver).game)->_priority[lVar10]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
          }
          uVar17 = 1L << (local_c8 & 0x3f);
          puVar1 = (this->V)._bits + (local_c8 >> 6);
          *puVar1 = *puVar1 | uVar17;
          local_b0._bits[local_c8 >> 6] = local_b0._bits[local_c8 >> 6] | uVar17;
          this->str[local_c8] = -1;
          iVar16 = (this->Q).pointer;
          (this->Q).pointer = iVar16 + 1;
          (this->Q).queue[iVar16] = (uint)local_c8;
          while( true ) {
            iVar16 = (this->Q).pointer;
            if ((long)iVar16 == 0) break;
            (this->Q).pointer = iVar16 + -1;
            uVar8 = (this->Q).queue[(long)iVar16 + -1];
            bVar14 = (byte)uVar8 & 0x3f;
            local_58._bits[(ulong)(long)(int)uVar8 >> 6] =
                 local_58._bits[(ulong)(long)(int)uVar8 >> 6] &
                 (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
            attractVertices(this,pl,uVar8,&local_58,&local_b0,&local_58,maxpr);
            attractTangles(this,pl,uVar8,&local_58,&local_b0,&local_58,maxpr);
          }
          local_c8 = bitset::find_prev(&local_58,local_c8);
          bVar21 = local_c8 == 0xffffffffffffffff;
          if (bVar21) break;
          lVar10 = (long)(int)local_c8;
          uVar15 = ((this->super_Solver).game)->_priority[lVar10];
        }
      }
      if (1 < (this->super_Solver).trace) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m ",0x11);
        uVar17 = local_70 & 0xffffffff;
        if (0 < (int)local_70) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger,"*",1);
            uVar15 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar15;
          } while (uVar15 != 0);
        }
        poVar11 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\x1b[1;36m",7);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,maxpr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\x1b[m",3);
        sVar18 = 0xffffffffffffffff;
        if (local_b0._bitssize != 0) {
          lVar10 = local_b0._bitssize * -0x40;
          sVar12 = local_b0._bitssize;
          do {
            lVar10 = lVar10 + 0x40;
            if (local_b0._bits[sVar12 - 1] != 0) {
              sVar18 = LZCOUNT(local_b0._bits[sVar12 - 1]) - lVar10 ^ 0x3f;
              break;
            }
            sVar12 = sVar12 - 1;
          } while (sVar12 != 0);
        }
        for (; sVar18 != 0xffffffffffffffff; sVar18 = bitset::find_prev(&local_b0,sVar18)) {
          poVar11 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," \x1b[1;38;5;15m",0xd);
          local_88.g = (this->super_Solver).game;
          local_88.v = (int)sVar18;
          poVar11 = operator<<(poVar11,&local_88);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\x1b[m",3);
          if (this->str[sVar18] != -1) {
            poVar11 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"->",2);
            local_88.g = (this->super_Solver).game;
            local_88.v = this->str[sVar18];
            operator<<(poVar11,&local_88);
          }
        }
        poVar11 = (this->super_Solver).logger;
        cVar5 = (char)poVar11;
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
      }
      if ((bool)(only_player == -1 & bVar21)) {
LAB_00177a4b:
        pbVar6 = local_68;
        lVar10 = ((this->super_Solver).game)->n_vertices;
        if (lVar10 != 0) {
          memset(this->pea_vidx,0,lVar10 << 2);
        }
        this->pea_curidx = 1;
        iVar16 = this->dominions;
        sVar18 = (this->V)._bitssize;
        uVar17 = 0xffffffffffffffff;
        if (sVar18 != 0) {
          lVar10 = sVar18 * -0x40;
          do {
            lVar10 = lVar10 + 0x40;
            if (this_00->_bits[sVar18 - 1] != 0) {
              uVar17 = LZCOUNT(this_00->_bits[sVar18 - 1]) - lVar10 ^ 0x3f;
              break;
            }
            sVar18 = sVar18 - 1;
          } while (sVar18 != 0);
        }
        for (; uVar17 != 0xffffffffffffffff; uVar17 = bitset::find_prev(this_00,uVar17)) {
          if ((local_b0._bits[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
            this_01 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_01,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/rtl.cpp"
                         ,0x203);
            __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
          }
          bVar21 = extractTangles(this,(int)uVar17,&local_b0);
          local_90 = local_90 & 0xff;
          if (bVar21) {
            local_90 = 1;
          }
        }
        local_74 = this->dominions;
        if (iVar16 == local_74) {
          sVar18 = (this->V)._bitssize;
          uVar17 = 0xffffffffffffffff;
          if (sVar18 != 0) {
            lVar10 = sVar18 * -0x40;
            do {
              lVar10 = lVar10 + 0x40;
              if (this_00->_bits[sVar18 - 1] != 0) {
                uVar17 = LZCOUNT(this_00->_bits[sVar18 - 1]) - lVar10 ^ 0x3f;
                break;
              }
              sVar18 = sVar18 - 1;
            } while (sVar18 != 0);
          }
          do {
            if (uVar17 == 0xffffffffffffffff) goto LAB_00177ea3;
            uVar19 = uVar17 >> 6;
            if ((local_b0._bits[uVar19] >> (uVar17 & 0x3f) & 1) != 0) {
              if (1 < (this->super_Solver).trace) {
                poVar11 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\x1b[1;37mattracting to top vertex \x1b[36m",0x25);
                local_88.g = (this->super_Solver).game;
                local_88.v = (uint)uVar17;
                poVar11 = operator<<(poVar11,&local_88);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\x1b[m",3);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
              }
              uVar20 = 1L << (uVar17 & 0x3f);
              puVar1 = (this->W)._bits + uVar19;
              *puVar1 = *puVar1 | uVar20;
              local_b0._bits[uVar19] = local_b0._bits[uVar19] & ~uVar20;
              iVar2 = (this->Q).pointer;
              (this->Q).pointer = iVar2 + 1;
              (this->Q).queue[iVar2] = (uint)uVar17;
              goto LAB_00177ea3;
            }
            uVar17 = bitset::find_prev(this_00,uVar17);
          } while( true );
        }
        for (sVar18 = bitset::find_first(pbVar6); sVar18 != 0xffffffffffffffff;
            sVar18 = bitset::find_next(pbVar6,sVar18)) {
          iVar2 = (this->Q).pointer;
          (this->Q).pointer = iVar2 + 1;
          (this->Q).queue[iVar2] = (uint)sVar18;
        }
        while( true ) {
          R_00 = local_38;
          iVar2 = (this->Q).pointer;
          if ((long)iVar2 == 0) break;
          (this->Q).pointer = iVar2 + -1;
          uVar8 = (this->Q).queue[(long)iVar2 + -1];
          attractVertices(this,pl,uVar8,local_38,pbVar6,local_38,0x7fffffff);
          attractTangles(this,pl,uVar8,R_00,pbVar6,R_00,0x7fffffff);
        }
        for (sVar18 = bitset::find_first(pbVar6); sVar18 != 0xffffffffffffffff;
            sVar18 = bitset::find_next(pbVar6,sVar18)) {
          Oink::solve((this->super_Solver).oink,(int)sVar18,pl,this->str[sVar18]);
        }
        sVar18 = (this->G)._bitssize;
        if (sVar18 != 0) {
          puVar9 = (this->G)._bits;
          puVar4 = (this->S)._bits;
          sVar12 = 0;
          do {
            puVar1 = puVar9 + sVar12;
            *puVar1 = *puVar1 & ~puVar4[sVar12];
            sVar12 = sVar12 + 1;
          } while (sVar18 != sVar12);
        }
        sVar18 = (this->S)._bitssize;
        if (sVar18 != 0) {
          memset(pbVar6->_bits,0,sVar18 << 3);
        }
        sVar18 = (this->V)._bitssize;
        if (sVar18 != 0) {
          memset(this_00->_bits,0,sVar18 << 3);
        }
        goto LAB_00177cc1;
      }
      sVar18 = (this->V)._bitssize;
      uVar17 = 0xffffffffffffffff;
      if (sVar18 != 0) {
        lVar10 = sVar18 * -0x40;
        do {
          lVar10 = lVar10 + 0x40;
          if (this_00->_bits[sVar18 - 1] != 0) {
            uVar17 = LZCOUNT(this_00->_bits[sVar18 - 1]) - lVar10 ^ 0x3f;
            break;
          }
          sVar18 = sVar18 - 1;
        } while (sVar18 != 0);
      }
      if (uVar17 != 0xffffffffffffffff) {
        do {
          pGVar3 = (this->super_Solver).game;
          uVar8 = (uint)uVar17;
          if ((((pGVar3->_owner)._bits[(ulong)(long)(int)uVar8 >> 6] >> (uVar17 & 0x3f) & 1) == 0)
              == (bool)((byte)maxpr & 1)) {
            iVar16 = pGVar3->_outedges[pGVar3->_firstouts[(int)uVar8]];
            if (iVar16 != -1) {
              piVar13 = pGVar3->_outedges + (long)pGVar3->_firstouts[(int)uVar8] + 1;
              do {
                if ((local_58._bits[(ulong)(long)iVar16 >> 6] >> ((long)iVar16 & 0x3fU) & 1) != 0)
                goto LAB_0017790b;
                iVar16 = *piVar13;
                piVar13 = piVar13 + 1;
              } while (iVar16 != -1);
            }
          }
          else if (this->str[uVar17] == -1) {
LAB_0017790b:
            uVar19 = 1L << (uVar17 & 0x3f);
            puVar1 = (this->W)._bits + (uVar17 >> 6);
            *puVar1 = *puVar1 | uVar19;
            local_b0._bits[uVar17 >> 6] = local_b0._bits[uVar17 >> 6] & ~uVar19;
            iVar16 = (this->Q).pointer;
            (this->Q).pointer = iVar16 + 1;
            (this->Q).queue[iVar16] = uVar8;
          }
          uVar17 = bitset::find_prev(this_00,uVar17);
        } while (uVar17 != 0xffffffffffffffff);
      }
      iVar16 = (this->Q).pointer;
      while( true ) {
        pbVar6 = local_60;
        iVar2 = (this->Q).pointer;
        if ((long)iVar2 == 0) break;
        (this->Q).pointer = iVar2 + -1;
        uVar8 = (this->Q).queue[(long)iVar2 + -1];
        bVar14 = (byte)uVar8 & 0x3f;
        local_b0._bits[(ulong)(long)(int)uVar8 >> 6] =
             local_b0._bits[(ulong)(long)(int)uVar8 >> 6] &
             (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
        attractVertices(this,pl ^ 1,uVar8,&local_b0,local_60,&local_b0,maxpr);
        attractTangles(this,pl ^ 1,uVar8,&local_b0,pbVar6,&local_b0,maxpr);
      }
      if (iVar16 == 0) goto LAB_00177a4b;
      goto LAB_00177cd4;
    }
    local_c8 = bitset::find_prev(&local_58,local_c8);
    bVar21 = false;
    goto LAB_00177d8c;
  }
  bVar14 = 0;
LAB_00177f3c:
  if (local_b0._bits != (uint64_t *)0x0) {
    operator_delete__(local_b0._bits);
  }
  if (local_58._bits != (uint64_t *)0x0) {
    operator_delete__(local_58._bits);
  }
  return (bool)(bVar14 & 1);
LAB_00177ea3:
  while( true ) {
    pbVar6 = local_60;
    iVar2 = (this->Q).pointer;
    if ((long)iVar2 == 0) break;
    (this->Q).pointer = iVar2 + -1;
    uVar8 = (this->Q).queue[(long)iVar2 + -1];
    bVar14 = (byte)uVar8 & 0x3f;
    local_b0._bits[(ulong)(long)(int)uVar8 >> 6] =
         local_b0._bits[(ulong)(long)(int)uVar8 >> 6] &
         (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
    attractVertices(this,pl ^ 1,uVar8,&local_b0,local_60,&local_b0,maxpr);
    attractTangles(this,pl ^ 1,uVar8,&local_b0,pbVar6,&local_b0,maxpr);
  }
LAB_00177cc1:
  bVar21 = true;
  if (iVar16 == local_74) {
LAB_00177cd4:
    sVar18 = (this->V)._bitssize;
    if (sVar18 != 0) {
      memset((this->V)._bits,0,sVar18 << 3);
    }
    sVar18 = (this->W)._bitssize;
    if (sVar18 != 0) {
      memset((this->W)._bits,0,sVar18 << 3);
    }
    uVar17 = 0;
    do {
      uVar19 = uVar17;
      if (local_b0._bitssize == uVar19) goto LAB_00177d6c;
      uVar17 = uVar19 + 1;
    } while (local_b0._bits[uVar19] == 0);
    if (local_b0._bitssize != uVar19) {
      iVar16 = this->dominions;
      bVar7 = rtl(this,&local_b0,only_player,local_78);
      local_90 = local_90 & 0xff;
      bVar21 = true;
      if (bVar7) {
        local_90 = 1;
      }
      if (iVar16 != this->dominions) goto LAB_00177d8c;
    }
LAB_00177d6c:
    if (local_b0._bitssize == 0) {
      bVar21 = false;
    }
    else {
      bVar21 = false;
      memset(local_b0._bits,0,local_b0._bitssize << 3);
    }
  }
LAB_00177d8c:
  if (bVar21) {
    bVar14 = 1;
    goto LAB_00177f3c;
  }
  if (local_c8 == 0xffffffffffffffff) goto LAB_00177f2f;
  goto LAB_00177450;
LAB_00177f2f:
  bVar14 = (byte)local_90;
  goto LAB_00177f3c;
}

Assistant:

bool
RTLSolver::rtl(bitset &SG, int only_player, int depth)
{
    bitset R(SG); // make a local copy of SG
    bitset Z(nodecount());

    bool new_tangles = false;

    auto top = R.find_last();

    while (top != bitset::npos) {
        const int pr = priority(top);
        const int pl = priority(top)&1;

        if (only_player != -1 && only_player != pl) {
            // oh. 
            top = R.find_prev(top);
            continue;
        }
            
        // attract from all heads with priority <pr> that are in <R>
        for (; top != bitset::npos; top = R.find_prev(top)) {
            if ((priority(top)&1) != (pr&1)) break; // otf compress
            // if (priority(top) != pr) break; // disable otf compress

#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[1;37mattracting to \033[36m" << label_vertex(top) << "\033[m for \033[1;36m" << pl << "\033[m" << " (pr: " << priority(top) << ")" << std::endl;
            }
#endif

            V[top] = true; // heads
            Z[top] = true; // add to <Z>
            str[top] = -1;
            Q.push(top);

            while (Q.nonempty()) {
                const int v = Q.pop();
                R[v] = false; // remove from <R>
                attractVertices(pl, v, R, Z, R, pr);
                attractTangles(pl, v, R, Z, R, pr);
            }
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m ";
            for (int i=0; i<depth; i++) logger << "*";
            logger << "\033[1;36m" << pr << "\033[m";
            for (auto v = Z.find_last(); v != bitset::npos; v = Z.find_prev(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
        }
#endif

        bool leaks = false;

        if (!(only_player == -1 and top == bitset::npos)) { // if not lowest region
            // figure out what are good heads.
            for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                // check if open
                if (owner(v) == pl) {
                    if (str[v] == -1) {
                        W[v] = true;
                        Z[v] = false;
                        Q.push(v);
                    }
                } else {
                    for (auto curedge = outs(v); *curedge != -1; curedge++) {
                        if (R[*curedge]) {
                            W[v] = true;
                            Z[v] = false;
                            Q.push(v);
                            break;
                        }
                    }
                }
            }

            leaks = Q.nonempty();

            while (Q.nonempty()) {
                const int v = Q.pop();
                Z[v] = false; // remove from <Z>
                attractVertices(1-pl, v, Z, W, Z, pr);
                attractTangles(1-pl, v, Z, W, Z, pr);
            }
        }

        if (!leaks) {
            /**
             * Extract tangles by computing bottom SCCs starting at each top vertex.
             * Note: each bottom SCC must contain a top vertex.
             */

            std::fill(pea_vidx, pea_vidx+nodecount(), '\0');
            pea_curidx = 1;

            const auto D = dominions;
            for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                if (!Z[v]) LOGIC_ERROR;
                if (extractTangles(v, Z)) new_tangles = true;
            }

            // Extend any dominions that were found.
            // (Any solved vertices are now in <S>.)
            if (D != dominions) {
                for (auto v = S.find_first(); v != bitset::npos; v = S.find_next(v)) Q.push(v);

                while (Q.nonempty()) {
                    const int v = Q.pop();
                    attractVertices(pl, v, G, S, G, INT_MAX);
                    attractTangles(pl, v, G, S, G, INT_MAX);
                }

                for (auto v = S.find_first(); v != bitset::npos; v = S.find_next(v)) {
                    Solver::solve(v, pl, str[v]);
                }

                G -= S; // remove from G
                S.reset();
                V.reset();
                return true; // end tl so that we can restart...
            }

            // now if we want to recursively decompose closed regions,
            // we need to remove some top part of the region.
            // the fact that we attract to multiple tops makes this a bit awkward, though.
            // TODO: a better method might be to simply check all newly learned tangles, and
            // then avoid the top vertices of those new tangles?
            if (RECURSIVE_CLOSED_REGIONS) {
                for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                    if (Z[v]) {
                        if (trace >= 2) {
                            logger << "\033[1;37mattracting to top vertex \033[36m" << label_vertex(v) << "\033[m" << std::endl;
                        }
                        W[v] = true;
                        Z[v] = false;
                        Q.push(v);
                        break; // only pick one highest-priority vertex to avoid
                    }
                }

                while (Q.nonempty()) {
                    const int v = Q.pop();
                    Z[v] = false; // remove from <Z>
                    attractVertices(1-pl, v, Z, W, Z, pr);
                    attractTangles(1-pl, v, Z, W, Z, pr);
                }
            }
        }

        if (RECURSIVE_CLOSED_REGIONS || leaks) {
            V.reset();
            W.reset();

            if (Z.any()) {
                const auto D = dominions;
                if (rtl(Z, only_player, depth+1)) {
                    new_tangles = true;
                }
                if (D != dominions) return true; // full restart
            }
        } else {
            V.reset();
        }

        Z.reset();
    }

    return new_tangles;
}